

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void andres::marray_detail::
     OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::Assign<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
     ::operate(View<float,_false,_std::allocator<unsigned_long>_> *v,undefined8 x,long param_3)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,4);
  if (sVar1 != 0) {
    uVar2 = 0;
    do {
      OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::Assign<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,x,param_3);
      sVar1 = View<float,_false,_std::allocator<unsigned_long>_>::strides(v,4);
      param_3 = param_3 + sVar1 * 4;
      uVar2 = uVar2 + 1;
      sVar1 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,4);
    } while (uVar2 < sVar1);
  }
  View<float,_false,_std::allocator<unsigned_long>_>::shape(v,4);
  View<float,_false,_std::allocator<unsigned_long>_>::strides(v,4);
  return;
}

Assistant:

static inline void operate
    (
        View<T1, false, A>& v, 
        const T2& x, 
        Functor f, 
        T1* data
    )
    {
        for(std::size_t j=0; j<v.shape(N-1); ++j) {
            OperateHelperBinaryScalar<N-1, Functor, T1, T2, A>::operate(
                v, x, f, data);
            data += v.strides(N-1);
        }
        data -= v.shape(N-1) * v.strides(N-1);
    }